

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall google::protobuf::MessageLite::ParseFromIstream(MessageLite *this,istream *input)

{
  bool bVar1;
  IstreamInputStream zero_copy_input;
  IstreamInputStream *local_70;
  IstreamInputStream local_68;
  
  io::IstreamInputStream::IstreamInputStream(&local_68,input,-1);
  local_70 = &local_68;
  bVar1 = ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,google::protobuf::io::ZeroCopyInputStream*>
                    (this,(ZeroCopyInputStream **)&local_70);
  if (bVar1) {
    bVar1 = (bool)(((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) >> 1);
  }
  else {
    bVar1 = false;
  }
  local_68.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__IstreamInputStream_0061f2c0;
  io::CopyingInputStreamAdaptor::~CopyingInputStreamAdaptor(&local_68.impl_);
  io::IstreamInputStream::CopyingIstreamInputStream::~CopyingIstreamInputStream
            (&local_68.copying_input_);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFromIstream(std::istream* input) {
  io::IstreamInputStream zero_copy_input(input);
  return ParseFromZeroCopyStream(&zero_copy_input) && input->eof();
}